

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_trex(MovDemuxer *this,MOVAtom atom)

{
  pointer *ppMVar1;
  iterator __position;
  pointer pMVar2;
  uint uVar3;
  
  __position._M_current =
       (this->trex_data).
       super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->trex_data).
      super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::
    _M_realloc_insert<>(&this->trex_data,__position);
  }
  else {
    (__position._M_current)->track_id = 0;
    (__position._M_current)->stsd_id = 0;
    (__position._M_current)->duration = 0;
    (__position._M_current)->size = 0;
    (__position._M_current)->flags = 0;
    ppMVar1 = &(this->trex_data).
               super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  pMVar2 = (this->trex_data).
           super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar2[-1].track_id = uVar3;
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar2[-1].stsd_id = uVar3;
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar2[-1].duration = uVar3;
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar2[-1].size = uVar3;
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar2[-1].flags = uVar3;
  return 0;
}

Assistant:

int MovDemuxer::mov_read_trex(MOVAtom atom)
{
    trex_data.emplace_back();
    MOVTrackExt& trex = trex_data[trex_data.size() - 1];
    get_byte();  // version
    get_be24();  // flags
    trex.track_id = static_cast<int>(get_be32());
    trex.stsd_id = get_be32();
    trex.duration = get_be32();
    trex.size = get_be32();
    trex.flags = get_be32();
    return 0;
}